

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O3

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::Reset
          (ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_> *this,
          ChContactable_1vars<3> *mobjA,ChContactable_1vars<3> *mobjB,ChCollisionInfo *cinfo,
          ChMaterialCompositeSMC *mat)

{
  ChContactable_1vars<3> *pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double local_88;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::Reset_cinfo
            (&this->
              super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>,
             mobjA,mobjB,cinfo);
  if (cinfo->distance < 0.0) {
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
             objA;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->
                   super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
                   ).norm_dist;
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar2 = vxorpd_avx512vl(auVar3,auVar2);
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[10])
              (&local_48,pCVar1,
               &(this->
                super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
                ).p1);
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
             objB;
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[10])
              (&local_60,pCVar1,
               &(this->
                super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
                ).p2);
    local_88 = auVar2._0_8_;
    CalculateForce(&local_78,this,local_88,
                   &(this->
                    super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
                    ).normal,&local_48,&local_60,mat);
    if (&local_78 != &this->m_force) {
      (this->m_force).m_data[0] = local_78.m_data[0];
      (this->m_force).m_data[1] = local_78.m_data[1];
      (this->m_force).m_data[2] = local_78.m_data[2];
    }
    if (*(char *)&(((this->
                    super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
                    ).container)->super_ChPhysicsItem).system[1].assembly.super_ChPhysicsItem.
                  super_ChObj._vptr_ChObj == '\x01') {
      CreateJacobians(this);
      CalculateJacobians(this,mat);
    }
    return;
  }
  __assert_fail("cinfo.distance < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactSMC.h"
                ,0x119,
                "void chrono::ChContactSMC<chrono::ChContactable_1vars<3>, chrono::ChContactable_1vars<3>>::Reset(Ta *, Tb *, const collision::ChCollisionInfo &, const ChMaterialCompositeSMC &) [Ta = chrono::ChContactable_1vars<3>, Tb = chrono::ChContactable_1vars<3>]"
               );
}

Assistant:

void Reset(Ta* mobjA,                                ///< collidable object A
               Tb* mobjB,                                ///< collidable object B
               const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
               const ChMaterialCompositeSMC& mat         ///< composite material
    ) {
        // Reset geometric information
        this->Reset_cinfo(mobjA, mobjB, cinfo);

        // Note: cinfo.distance is the same as this->norm_dist.
        assert(cinfo.distance < 0);

        // Calculate contact force.
        m_force = CalculateForce(-this->norm_dist,                            // overlap (here, always positive)
                                 this->normal,                                // normal contact direction
                                 this->objA->GetContactPointSpeed(this->p1),  // velocity of contact point on objA
                                 this->objB->GetContactPointSpeed(this->p2),  // velocity of contact point on objB
                                 mat                                          // composite material for contact pair
        );

        // Set up and compute Jacobian matrices.
        if (static_cast<ChSystemSMC*>(this->container->GetSystem())->GetStiffContact()) {
            CreateJacobians();
            CalculateJacobians(mat);
        }
    }